

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double *draw_points;
  int iVar1;
  double *pdVar2;
  double *points_y;
  double *points_z;
  ostream *poVar3;
  string *this;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  double dist;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 in_XMM3 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  int num_draw_points;
  int num_small_lig;
  int num_points;
  double local_358;
  double beam_rad;
  double local_348;
  double dStack_340;
  double local_338;
  double local_330;
  double *local_328;
  double local_320;
  int local_314;
  double *local_310;
  double *local_308;
  double *local_300;
  undefined1 local_2f8 [16];
  double local_2e8;
  double dStack_2e0;
  int reg_type;
  string str_1;
  string path;
  string path_2;
  string local_250;
  string str;
  
  local_328 = (double *)operator_new__(480000000);
  num_draw_points = 0;
  reg_type = 1;
  std::operator<<((ostream *)&std::cout,"What strructure you want in the cube? \n");
  std::operator<<((ostream *)&std::cout,"Enter (1) for  Honeycomb Structure \n");
  std::operator<<((ostream *)&std::cout,"Enter (2) for  Irregular Voronoi Structure \n");
  std::istream::operator>>((istream *)&std::cin,&reg_type);
  num_points = 0x22f;
  std::operator<<((ostream *)&std::cout,
                  "Enter the number of seeds you want inside the unite cube \n");
  std::istream::operator>>((istream *)&std::cin,&num_points);
  beam_rad = 0.0;
  num_small_lig = 0;
  dVar10 = (double)num_points * 1.4142135623730951;
  dVar11 = 0.3333333333333333;
  local_338 = pow((_x0 * _x0 * _x0) / dVar10,0.3333333333333333);
  iVar1 = reg_type;
  iVar7 = num_points;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)num_points) {
    uVar4 = (long)num_points * 8;
  }
  pdVar2 = (double *)operator_new__(uVar4);
  points_y = (double *)operator_new__(uVar4);
  points_z = (double *)operator_new__(uVar4);
  if (iVar1 == 1) {
    regular_points_seeds(pdVar2,points_y,points_z,dist);
    draw_points = local_328;
    tet_gen_honeycomb(iVar7,pdVar2,points_y,points_z,&beam_rad,0.03,&num_draw_points,local_328);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"../output/00_Drawing.dxf",(allocator<char> *)&str_1);
    draw_cells(draw_points,num_draw_points,&str);
    std::operator<<((ostream *)&std::cout,"beam_rad\t:");
    local_348 = beam_rad;
    poVar3 = std::ostream::_M_insert<double>(beam_rad);
    poVar3 = std::operator<<(poVar3,"\tinch");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"beam_diameter\t:");
    poVar3 = std::ostream::_M_insert<double>(local_348 * 0.0254 + local_348 * 0.0254);
    poVar3 = std::operator<<(poVar3,"\tm");
    std::endl<char,std::char_traits<char>>(poVar3);
    operator_delete__(pdVar2);
    this = &str;
  }
  else {
    local_308 = points_z;
    local_300 = points_y;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str_1,"../output/",(allocator<char> *)&str);
    local_338 = local_338 * 1.224744871391589 * 0.9;
    local_2f8 = ZEXT816(0);
    local_330 = 0.0;
    local_2e8 = 0.0;
    dStack_2e0 = 0.0;
    local_310 = pdVar2;
    for (lVar6 = 0; pdVar2 = local_310, lVar6 != 0x14; lVar6 = lVar6 + 1) {
      local_314 = 0;
      uVar4 = (ulong)(uint)(&DAT_00168370)[lVar6];
      local_358 = dVar11;
      mps_3d_for_high_regularity
                (local_310,local_300,local_308,num_points,local_338,&local_314,
                 (&DAT_00168370)[lVar6]);
      for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
        auVar8._0_4_ = -(uint)(iVar7 == 0);
        auVar8._4_4_ = -(uint)(iVar7 == 1);
        auVar8._8_4_ = -(uint)(iVar7 == 2);
        auVar8._12_4_ = -(uint)(iVar7 == 3);
        uVar5 = movmskps((int)points_y,auVar8);
        points_y = (double *)(ulong)uVar5;
        dVar11 = 0.01;
        if ((uVar5 & 1) == 0) {
          dVar11 = local_358;
        }
        dVar12 = 0.03;
        if ((uVar5 & 2) == 0) {
          dVar12 = dVar11;
        }
        local_320 = 0.05;
        if ((uVar5 & 4) == 0) {
          local_320 = dVar12;
        }
        dVar11 = 0.07;
        if ((uVar5 & 8) == 0) {
          dVar11 = local_320;
        }
        local_358 = 0.09;
        if (iVar7 != 4) {
          local_358 = dVar11;
        }
        tet_gen(num_points,local_310,local_300,local_308,&beam_rad,local_358,local_358,dVar10,
                (int)uVar4,in_XMM3._0_8_,&num_small_lig,&num_draw_points,local_328);
        local_348 = beam_rad;
        dStack_340 = 0.0;
        if (iVar7 == 4) {
          local_330 = local_330 + beam_rad;
        }
        std::__cxx11::to_string(&path_2,(int)lVar6);
        std::operator+(&str,&str_1,&path_2);
        std::operator+(&path,&str,".dxf");
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&path_2);
        if ((uVar5 & 1) != 0) {
          draw_cells(local_328,num_draw_points,&path);
        }
        std::__cxx11::to_string(&local_250,(int)lVar6);
        std::operator+(&str,&str_1,&local_250);
        std::operator+(&path_2,&str,".txt");
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&local_250);
        if ((uVar5 & 1) == 0) {
          std::ofstream::ofstream(&str,(string *)&path_2,_S_app);
          std::operator<<((ostream *)&str,"denesity\t");
          poVar3 = std::ostream::_M_insert<double>(local_358);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::operator<<((ostream *)&str,"beam_rad\t");
          poVar3 = std::ostream::_M_insert<double>(local_348);
          poVar3 = std::operator<<(poVar3,"\tinch");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&str,"num_small_lig\t");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,num_small_lig);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::operator<<((ostream *)&str,"regularity\t");
          poVar3 = std::ostream::_M_insert<double>(0.9);
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&str,"***********************");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          std::ofstream::ofstream(&str,(string *)&path_2,_S_out);
          std::operator<<((ostream *)&str,"denesity\t");
          poVar3 = std::ostream::_M_insert<double>(local_320);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::operator<<((ostream *)&str,"beam_rad\t");
          poVar3 = std::ostream::_M_insert<double>(local_348);
          poVar3 = std::operator<<(poVar3,"\tinch");
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&str,"num_small_lig\t");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,num_small_lig);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::operator<<((ostream *)&str,"regularity\t");
          poVar3 = std::ostream::_M_insert<double>(0.9);
          std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<((ostream *)&str,"***********************");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        std::ofstream::~ofstream(&str);
        auVar9._0_8_ = CONCAT44(auVar8._0_4_,auVar8._0_4_);
        auVar9._8_4_ = auVar8._4_4_;
        auVar9._12_4_ = auVar8._4_4_;
        auVar13._0_8_ = CONCAT44(auVar8._8_4_,auVar8._8_4_);
        auVar13._8_4_ = auVar8._12_4_;
        auVar13._12_4_ = auVar8._12_4_;
        dVar10 = local_2f8._0_8_ + local_348;
        dVar11 = local_2f8._8_8_ + local_348;
        dVar12 = local_348 + dStack_2e0;
        local_348 = (double)(~auVar13._0_8_ & (ulong)local_2e8 |
                            (ulong)(local_348 + local_2e8) & auVar13._0_8_);
        dStack_340 = (double)(~auVar13._8_8_ & (ulong)dStack_2e0 | (ulong)dVar12 & auVar13._8_8_);
        in_XMM3._0_8_ = (ulong)dVar10 & auVar9._0_8_;
        in_XMM3._8_8_ = (ulong)dVar11 & auVar9._8_8_;
        in_XMM3 = in_XMM3 | ~auVar9 & local_2f8;
        dVar10 = local_2e8;
        local_2f8 = in_XMM3;
        std::__cxx11::string::~string((string *)&path_2);
        std::__cxx11::string::~string((string *)&path);
        local_2e8 = local_348;
        dStack_2e0 = dStack_340;
      }
      dVar11 = local_358;
    }
    std::ofstream::ofstream(&str,"../output/mean_beam_radius.txt",_S_out);
    std::operator<<((ostream *)&str,"regularity\t");
    poVar3 = std::ostream::_M_insert<double>(0.9);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&str,"m_rad_1\t");
    poVar3 = std::ostream::_M_insert<double>((double)local_2f8._0_8_ / 20.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&str,"m_rad_3\t");
    poVar3 = std::ostream::_M_insert<double>((double)local_2f8._8_8_ / 20.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&str,"m_rad_5\t");
    poVar3 = std::ostream::_M_insert<double>(local_2e8 / 20.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&str,"m_rad_7\t");
    poVar3 = std::ostream::_M_insert<double>(dStack_2e0 / 20.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&str,"m_rad_9\t");
    poVar3 = std::ostream::_M_insert<double>(local_330 / 20.0);
    std::endl<char,std::char_traits<char>>(poVar3);
    operator_delete__(pdVar2);
    std::ofstream::~ofstream(&str);
    this = &str_1;
  }
  std::__cxx11::string::~string((string *)this);
  return 0;
}

Assistant:

int main()
{
	// creat array that holds voroni vertices
	double *draw_points;
	draw_points = new double[60000000];
	int num_draw_points = 0;

	//Create a parameter to check whether the user want to generate a honeycomb structure 1 or random voronoi diagram
	int reg_type = 1;
	cout << "What strructure you want in the cube? \n";
	cout << "Enter (1) for  Honeycomb Structure \n";
	cout << "Enter (2) for  Irregular Voronoi Structure \n";
	cin >> reg_type;

	//the required number of seed inside the unite cube
	int num_points = 559;
	cout << "Enter the number of seeds you want inside the unite cube \n";
	cin >> num_points;

	int num_itr = 1;
	double *points_x, *points_y, *points_z;

	// Create variables that holds Vornoi ligaments characteristics
	double beam_rad = 0.0;
	int num_small_lig = 0;
	double denesity;

	// calculate the required distance to generate complete regulare voronoi structure for "num_points" seeds in unite cube "_x0*_x0*_x0"
	double r_reg;
	r_reg = min_dist_req_3d(_x0 * _x0 * _x0, num_points);

	//in case of user want to generate complete regulare structure "honeycomb"
	if (reg_type == 1)
	{
		// set the the required density of model
		denesity = 0.03;

		// Create arrays holds seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		// generate regulare distribution seeds
		regular_points_seeds(points_x, points_y, points_z, r_reg);

		// Creating Vornoi vertices for honeycomb structure using TetGen library
		tet_gen_honeycomb(num_points, points_x, points_y, points_z, beam_rad, denesity, num_draw_points, draw_points);

		//set the destination for storing DXF file
		string str = "../output/00_Drawing.dxf";

		// Draw Honeycomb structure in dxf file
		draw_cells(draw_points, num_draw_points, str);

		//display voronoi ligaments radiaus in inch and in m
		cout << "beam_rad	:" << beam_rad << "	inch" << endl;
		cout << "beam_diameter	:" << beam_rad * .0254 * 2 << "	m" << endl;

		delete[] points_x, points_y, points_z;
	}
	//in case of user want to generete random distributing voronoi
	else
	{
		// random number geration function initiation
		int initiation = 0;

		//Regularity parameter 0 % complete irrigulare structure and 100% is honeycomb structure
		double e = 0.9;

		//these values are evaluated from running the code before. the code converge more quicly when srand() functions initiated with these values
		int good_initiation[20] = {2, 28, 29, 37, 45, 56, 70, 95, 104, 126, 162, 178, 205, 229, 243, 268, 309, 322, 326, 357};

		//create arrays holps seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		//location where the Dxf file and statistics .txt will be stored
		string str = "../output/";

		// this variable will hold density itration
		int e_itra = 0;
		double m_rad_1 = 0.0, m_rad_3 = 0.0, m_rad_5 = 0.0, m_rad_7 = 0.0, m_rad_9 = 0.0;

		//we need to generate 20 model automatically and store them in different distinations
		while (initiation < 20)
		{
			e_itra = 0;
			num_itr = 0;

			//use the modified MPS to generate vornoi with regularity 90%
			mps_3d_for_high_regularity(points_x, points_y, points_z, num_points, e * r_reg, num_itr, good_initiation[initiation]);
			//mps_3d(points_x,points_y,points_z, num_points, e*r_reg,num_itr,initiation);

			while (e_itra < 5)
			{
				if (e_itra == 0)
					denesity = .01;
				if (e_itra == 1)
					denesity = .03;
				if (e_itra == 2)
					denesity = .05;
				if (e_itra == 3)
					denesity = .07;
				if (e_itra == 4)
					denesity = .09;

				// Get Vornoi vertices using TetGen library
				tet_gen(num_points, points_x, points_y, points_z, beam_rad, denesity, r_reg, e, initiation, e * r_reg, num_small_lig, num_draw_points, draw_points);

				// sum the beam diameter for every density and at the end calculate the mean for 20 model
				if (e_itra == 0)
					m_rad_1 = m_rad_1 + beam_rad;
				if (e_itra == 1)
					m_rad_3 = m_rad_3 + beam_rad;
				if (e_itra == 2)
					m_rad_5 = m_rad_5 + beam_rad;
				if (e_itra == 3)
					m_rad_7 = m_rad_7 + beam_rad;
				if (e_itra == 4)
					m_rad_9 = m_rad_9 + beam_rad;

				// Draw Voronoi Seeds for the first itration of densities as the structure will not change by changing densities
				// only Vornoi legaments diameter will change
				string path = str + to_string(initiation) + ".dxf";
				if (e_itra == 0)
					draw_cells(draw_points, num_draw_points, path);

				string path_2 = str + to_string(initiation) + ".txt";

				if (e_itra == 0)
				{
					ofstream beam_radius(path_2, ios::out);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				else
				{
					ofstream beam_radius(path_2, ios::app);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				e_itra++;
			}
			initiation++;
		}

		// calculate the mean of Voronoi ligaments for 20 model and store them in dxf file
		ofstream beam_radius("../output/mean_beam_radius.txt", ios::out);
		beam_radius << "regularity	" << e << endl;
		beam_radius << "m_rad_1	" << m_rad_1 / initiation << endl;
		beam_radius << "m_rad_3	" << m_rad_3 / initiation << endl;
		beam_radius << "m_rad_5	" << m_rad_5 / initiation << endl;
		beam_radius << "m_rad_7	" << m_rad_7 / initiation << endl;
		beam_radius << "m_rad_9	" << m_rad_9 / initiation << endl;

		delete[] points_x, points_y, points_z;
	}
	return 0;
}